

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::cni_holder<bool_(*)(char),_bool_(*)(char)>::cni_holder
          (cni_holder<bool_(*)(char),_bool_(*)(char)> *this,_func_bool_char **func)

{
  function<bool_(char)> *in_RDI;
  cni_helper<bool_(*)(char),_bool_(*)(char)> *this_00;
  function<bool_(char)> *in_stack_ffffffffffffffc0;
  _func_bool_char *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_006c46e0;
  this_00 = (cni_helper<bool_(*)(char),_bool_(*)(char)> *)
            ((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<bool(char)>::function<bool(*const&)(char),void>(in_stack_ffffffffffffffc0,local_30);
  cni_helper<bool_(*)(char),_bool_(*)(char)>::cni_helper(this_00,in_RDI);
  std::function<bool_(char)>::~function((function<bool_(char)> *)0x48f966);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}